

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMBaseInfo.h
# Opt level: O0

char * ARMCC_ARMCondCodeToString(ARMCC_CondCodes CC)

{
  char *pcStack_10;
  ARMCC_CondCodes CC_local;
  
  switch(CC) {
  case ARMCC_EQ:
    pcStack_10 = "eq";
    break;
  case ARMCC_NE:
    pcStack_10 = "ne";
    break;
  case ARMCC_HS:
    pcStack_10 = "hs";
    break;
  case ARMCC_LO:
    pcStack_10 = "lo";
    break;
  case ARMCC_MI:
    pcStack_10 = "mi";
    break;
  case ARMCC_PL:
    pcStack_10 = "pl";
    break;
  case ARMCC_VS:
    pcStack_10 = "vs";
    break;
  case ARMCC_VC:
    pcStack_10 = "vc";
    break;
  case ARMCC_HI:
    pcStack_10 = "hi";
    break;
  case ARMCC_LS:
    pcStack_10 = "ls";
    break;
  case ARMCC_GE:
    pcStack_10 = "ge";
    break;
  case ARMCC_LT:
    pcStack_10 = "lt";
    break;
  case ARMCC_GT:
    pcStack_10 = "gt";
    break;
  case ARMCC_LE:
    pcStack_10 = "le";
    break;
  case ARMCC_AL:
    pcStack_10 = "al";
    break;
  default:
    pcStack_10 = anon_var_dwarf_8bdb4 + 0x11;
  }
  return pcStack_10;
}

Assistant:

inline static char *ARMCC_ARMCondCodeToString(ARMCC_CondCodes CC)
{
	switch (CC) {
		case ARMCC_EQ:  return "eq";
		case ARMCC_NE:  return "ne";
		case ARMCC_HS:  return "hs";
		case ARMCC_LO:  return "lo";
		case ARMCC_MI:  return "mi";
		case ARMCC_PL:  return "pl";
		case ARMCC_VS:  return "vs";
		case ARMCC_VC:  return "vc";
		case ARMCC_HI:  return "hi";
		case ARMCC_LS:  return "ls";
		case ARMCC_GE:  return "ge";
		case ARMCC_LT:  return "lt";
		case ARMCC_GT:  return "gt";
		case ARMCC_LE:  return "le";
		case ARMCC_AL:  return "al";
		default: return "";
	}
}